

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QByteArray_&,_const_char_(&)[9]>::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,QStringBuilder<QByteArray_&,_const_char_(&)[9]> *this)

{
  char cVar1;
  char *__dest;
  size_t __n;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  
  lVar3 = (this->a->d).size + 8;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,lVar3,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  __n = (this->a->d).size;
  if (__n != 0) {
    memcpy(__dest,(this->a->d).ptr,__n);
  }
  pcVar4 = __dest + __n;
  pcVar2 = *this->b;
  cVar1 = *pcVar2;
  while (cVar1 != '\0') {
    pcVar2 = pcVar2 + 1;
    *pcVar4 = cVar1;
    pcVar4 = pcVar4 + 1;
    cVar1 = *pcVar2;
  }
  if (lVar3 != (long)pcVar4 - (long)__dest) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }